

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

QLayoutItem * __thiscall QDockWidgetLayout::itemAt(QDockWidgetLayout *this,int index)

{
  long i_00;
  qsizetype qVar1;
  const_reference ppQVar2;
  int in_ESI;
  QList<QLayoutItem_*> *in_RDI;
  bool bVar3;
  QLayoutItem *item;
  int i;
  int cnt;
  int local_1c;
  int local_18;
  
  local_18 = 0;
  local_1c = 0;
  while( true ) {
    i_00 = (long)local_1c;
    qVar1 = QList<QLayoutItem_*>::size((QList<QLayoutItem_*> *)&in_RDI[1].d.ptr);
    if (qVar1 <= i_00) {
      return (QLayoutItem *)0x0;
    }
    ppQVar2 = QList<QLayoutItem_*>::at(in_RDI,i_00);
    if ((*ppQVar2 != (QLayoutItem *)0x0) &&
       (bVar3 = in_ESI == local_18, local_18 = local_18 + 1, bVar3)) break;
    local_1c = local_1c + 1;
  }
  return *ppQVar2;
}

Assistant:

QLayoutItem *QDockWidgetLayout::itemAt(int index) const
{
    int cnt = 0;
    for (int i = 0; i < item_list.size(); ++i) {
        QLayoutItem *item = item_list.at(i);
        if (item == nullptr)
            continue;
        if (index == cnt++)
            return item;
    }
    return nullptr;
}